

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O1

bool __thiscall llvm::yaml::dumpTokens(yaml *this,StringRef Input,raw_ostream *OS)

{
  uint uVar1;
  raw_ostream *this_00;
  char cVar2;
  StringRef Input_00;
  StringRef Str;
  StringRef Str_00;
  undefined1 local_208 [8];
  Scanner scanner;
  SourceMgr SM;
  Token T;
  
  SM.IncludeDirectories.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  SM.DiagHandler = (DiagHandlerTy)0x0;
  SM.IncludeDirectories.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  SM.IncludeDirectories.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  SM.Buffers.
  super__Vector_base<llvm::SourceMgr::SrcBuffer,_std::allocator<llvm::SourceMgr::SrcBuffer>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  SM.Buffers.
  super__Vector_base<llvm::SourceMgr::SrcBuffer,_std::allocator<llvm::SourceMgr::SrcBuffer>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  scanner.EC = (error_code *)0x0;
  SM.Buffers.
  super__Vector_base<llvm::SourceMgr::SrcBuffer,_std::allocator<llvm::SourceMgr::SrcBuffer>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  Input_00.Length = (size_t)Input.Data;
  Input_00.Data = (char *)this;
  Scanner::Scanner((Scanner *)local_208,Input_00,(SourceMgr *)&scanner.EC,true,(error_code *)0x0);
  do {
    Scanner::getNext((Token *)&SM.DiagContext,(Scanner *)local_208);
    uVar1 = (int)SM.DiagContext - 1;
    if (uVar1 < 0x16) {
      Str.Data = &DAT_00be9e10 + *(int *)(&DAT_00be9e10 + (ulong)uVar1 * 4);
      Str.Length = *(size_t *)(&DAT_00be9e68 + (ulong)uVar1 * 8);
      raw_ostream::operator<<((raw_ostream *)Input.Length,Str);
    }
    this_00 = raw_ostream::operator<<((raw_ostream *)Input.Length,(StringRef)T._0_16_);
    Str_00.Length = 1;
    Str_00.Data = "\n";
    raw_ostream::operator<<(this_00,Str_00);
    cVar2 = (int)SM.DiagContext == 0;
    if ((int)SM.DiagContext == 2) {
      cVar2 = '\x03';
    }
    if ((size_type *)T.Range.Length != &T.Value._M_string_length) {
      operator_delete((void *)T.Range.Length,T.Value._M_string_length + 1);
    }
  } while (cVar2 == '\0');
  if ((uint *)scanner.Indents.super_SmallVectorStorage<int,_4U>.InlineElts._8_8_ !=
      &scanner.SimpleKeys.super_SmallVectorImpl<(anonymous_namespace)::SimpleKey>.
       super_SmallVectorTemplateBase<(anonymous_namespace)::SimpleKey,_true>.
       super_SmallVectorTemplateCommon<(anonymous_namespace)::SimpleKey,_void>.super_SmallVectorBase
       .Size) {
    free((void *)scanner.Indents.super_SmallVectorStorage<int,_4U>.InlineElts._8_8_);
  }
  if (scanner.TokenQueue.List.Sentinel.
      super_ilist_node_impl<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>_>
      .super_node_base_type.Next !=
      (ilist_node_base<false> *)
      &scanner.Indents.super_SmallVectorImpl<int>.super_SmallVectorTemplateBase<int,_true>.
       super_SmallVectorTemplateCommon<int,_void>.super_SmallVectorBase.Size) {
    free(scanner.TokenQueue.List.Sentinel.
         super_ilist_node_impl<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>_>
         .super_node_base_type.Next);
  }
  AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>
  ::~AllocatorList((AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>
                    *)&scanner.IsStartOfStream);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&SM.Buffers.
                super__Vector_base<llvm::SourceMgr::SrcBuffer,_std::allocator<llvm::SourceMgr::SrcBuffer>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<llvm::SourceMgr::SrcBuffer,_std::allocator<llvm::SourceMgr::SrcBuffer>_>::~vector
            ((vector<llvm::SourceMgr::SrcBuffer,_std::allocator<llvm::SourceMgr::SrcBuffer>_> *)
             &scanner.EC);
  return cVar2 == '\x03';
}

Assistant:

bool yaml::dumpTokens(StringRef Input, raw_ostream &OS) {
  SourceMgr SM;
  Scanner scanner(Input, SM);
  while (true) {
    Token T = scanner.getNext();
    switch (T.Kind) {
    case Token::TK_StreamStart:
      OS << "Stream-Start: ";
      break;
    case Token::TK_StreamEnd:
      OS << "Stream-End: ";
      break;
    case Token::TK_VersionDirective:
      OS << "Version-Directive: ";
      break;
    case Token::TK_TagDirective:
      OS << "Tag-Directive: ";
      break;
    case Token::TK_DocumentStart:
      OS << "Document-Start: ";
      break;
    case Token::TK_DocumentEnd:
      OS << "Document-End: ";
      break;
    case Token::TK_BlockEntry:
      OS << "Block-Entry: ";
      break;
    case Token::TK_BlockEnd:
      OS << "Block-End: ";
      break;
    case Token::TK_BlockSequenceStart:
      OS << "Block-Sequence-Start: ";
      break;
    case Token::TK_BlockMappingStart:
      OS << "Block-Mapping-Start: ";
      break;
    case Token::TK_FlowEntry:
      OS << "Flow-Entry: ";
      break;
    case Token::TK_FlowSequenceStart:
      OS << "Flow-Sequence-Start: ";
      break;
    case Token::TK_FlowSequenceEnd:
      OS << "Flow-Sequence-End: ";
      break;
    case Token::TK_FlowMappingStart:
      OS << "Flow-Mapping-Start: ";
      break;
    case Token::TK_FlowMappingEnd:
      OS << "Flow-Mapping-End: ";
      break;
    case Token::TK_Key:
      OS << "Key: ";
      break;
    case Token::TK_Value:
      OS << "Value: ";
      break;
    case Token::TK_Scalar:
      OS << "Scalar: ";
      break;
    case Token::TK_BlockScalar:
      OS << "Block Scalar: ";
      break;
    case Token::TK_Alias:
      OS << "Alias: ";
      break;
    case Token::TK_Anchor:
      OS << "Anchor: ";
      break;
    case Token::TK_Tag:
      OS << "Tag: ";
      break;
    case Token::TK_Error:
      break;
    }
    OS << T.Range << "\n";
    if (T.Kind == Token::TK_StreamEnd)
      break;
    else if (T.Kind == Token::TK_Error)
      return false;
  }
  return true;
}